

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void raviV_op_setlist(lua_State *L,CallInfo *ci,TValue *ra,int b,int c)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ulong key;
  lua_Number *data_4;
  lua_Number lStack_a8;
  uint ukey_4;
  lua_Number d;
  lua_Number *data_3;
  uint ukey_3;
  lua_Number *data_2;
  uint ukey_2;
  lua_Integer *data_1;
  lua_Integer lStack_70;
  uint ukey_1;
  lua_Integer i_1;
  lua_Integer *data;
  uint ukey;
  uint u;
  TValue *val_1;
  RaviArray *pRStack_48;
  int i;
  RaviArray *h_1;
  TValue *val;
  Table *h;
  uint last;
  int n;
  int c_local;
  int b_local;
  TValue *ra_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  h._4_4_ = b;
  if (b == 0) {
    h._4_4_ = (int)((long)L->top - (long)ra >> 4) + -1;
  }
  h._0_4_ = (c + -1) * 0x32 + h._4_4_;
  last = c;
  n = b;
  _c_local = ra;
  ra_local = (TValue *)ci;
  ci_local = (CallInfo *)L;
  if (ra->tt_ == 0x8005) {
    if (ra->tt_ != 0x8005) {
      __assert_fail("((((ra))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xafe,"void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
    }
    if (((ra->value_).gc)->tt != '\x05') {
      __assert_fail("(((ra)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xafe,"void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
    }
    val = (TValue *)(ra->value_).gc;
    if (((Table *)val)->sizearray < (uint)h) {
      luaH_resizearray(L,(Table *)val,(uint)h);
    }
    for (; 0 < h._4_4_; h._4_4_ = h._4_4_ + -1) {
      h_1 = (RaviArray *)(_c_local + h._4_4_);
      key = (ulong)(uint)h;
      h._0_4_ = (uint)h - 1;
      luaH_setint((lua_State *)ci_local,(Table *)val,key,(TValue *)h_1);
      uVar1._0_1_ = h_1->tt;
      uVar1._1_1_ = h_1->marked;
      if ((uVar1 & 0x8000) != 0) {
        if (9 < ((byte)val->tt_ & 0xf)) {
          __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xb04,"void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)")
          ;
        }
        if ((val->tt_ & 0x2000) != 0) {
          uVar2._0_1_ = h_1->tt;
          uVar2._1_1_ = h_1->marked;
          if ((uVar2 & 0x8000) == 0) {
            __assert_fail("(((val)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb04,
                          "void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
          }
          if ((h_1->next->marked & 0x18) != 0) {
            if (9 < ((byte)val->tt_ & 0xf)) {
              __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                            ,0xb04,
                            "void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
            }
            luaC_barrierback_((lua_State *)ci_local,(GCObject *)val);
          }
        }
      }
    }
  }
  else {
    if ((ra->tt_ != 0x8015) && (ra->tt_ != 0x8025)) {
      __assert_fail("(((((ra))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((ra))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb08,"void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
    }
    if ((((ra->value_).gc)->tt != '\x15') && (((ra->value_).gc)->tt != '%')) {
      __assert_fail("((((ra)->value_).gc)->tt == ((5) | ((1) << 4)) || (((ra)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb08,"void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
    }
    pRStack_48 = (RaviArray *)(ra->value_).gc;
    val_1._4_4_ = (uint)h - h._4_4_;
    while (val_1._4_4_ = val_1._4_4_ + 1, (int)val_1._4_4_ <= (int)(uint)h) {
      _ukey = _c_local + (int)val_1._4_4_;
      data._4_4_ = val_1._4_4_;
      if ((pRStack_48->flags & 8) == 0) {
        if (_ukey->tt_ == 0x13) {
          data._0_4_ = val_1._4_4_;
          i_1 = (lua_Integer)pRStack_48->data;
          if (val_1._4_4_ < pRStack_48->len) {
            if (_ukey->tt_ != 0x13) {
              __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                            ,0xb0f,
                            "void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
            }
            *(Value *)(i_1 + (ulong)val_1._4_4_ * 8) = _ukey->value_;
          }
          else {
            if (_ukey->tt_ != 0x13) {
              __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                            ,0xb0f,
                            "void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
            }
            raviH_set_int((lua_State *)ci_local,pRStack_48,(ulong)val_1._4_4_,(_ukey->value_).i);
          }
        }
        else {
          lStack_70 = 0;
          if (_ukey->tt_ == 0x13) {
            if (_ukey->tt_ != 0x13) {
              __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                            ,0xb13,
                            "void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
            }
            lStack_70 = (_ukey->value_).i;
          }
          else {
            iVar3 = luaV_tointegerns(_ukey,&stack0xffffffffffffff90,F2Ieq);
            if (iVar3 == 0) {
              luaG_runerror((lua_State *)ci_local,"value cannot be converted to integer");
            }
          }
          if (data._4_4_ < pRStack_48->len) {
            *(lua_Integer *)(pRStack_48->data + (ulong)data._4_4_ * 8) = lStack_70;
          }
          else {
            raviH_set_int((lua_State *)ci_local,pRStack_48,(ulong)data._4_4_,lStack_70);
          }
        }
      }
      else if (_ukey->tt_ == 3) {
        if (val_1._4_4_ < pRStack_48->len) {
          if (_ukey->tt_ != 3) {
            __assert_fail("((((val))->tt_) == (((3) | ((0) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb1c,
                          "void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
          }
          *(Value *)(pRStack_48->data + (ulong)val_1._4_4_ * 8) = _ukey->value_;
        }
        else {
          if (_ukey->tt_ != 3) {
            __assert_fail("((((val))->tt_) == (((3) | ((0) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb1c,
                          "void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
          }
          raviH_set_float((lua_State *)ci_local,pRStack_48,(ulong)val_1._4_4_,(_ukey->value_).n);
        }
      }
      else if (_ukey->tt_ == 0x13) {
        if (val_1._4_4_ < pRStack_48->len) {
          if (_ukey->tt_ != 0x13) {
            __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb1f,
                          "void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
          }
          *(double *)(pRStack_48->data + (ulong)val_1._4_4_ * 8) = (double)(_ukey->value_).i;
        }
        else {
          if (_ukey->tt_ != 0x13) {
            __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb1f,
                          "void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
          }
          raviH_set_float((lua_State *)ci_local,pRStack_48,(ulong)val_1._4_4_,
                          (double)(_ukey->value_).i);
        }
      }
      else {
        if (_ukey->tt_ == 3) {
          if (_ukey->tt_ != 3) {
            __assert_fail("((((val))->tt_) == (((3) | ((0) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb23,
                          "void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
          }
          lStack_a8 = (_ukey->value_).n;
        }
        else {
          if (_ukey->tt_ != 0x13) {
            luaG_runerror((lua_State *)ci_local,"value cannot be converted to number");
          }
          if (_ukey->tt_ != 0x13) {
            __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb23,
                          "void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
          }
          lStack_a8 = (lua_Number)(_ukey->value_).i;
        }
        if (val_1._4_4_ < pRStack_48->len) {
          *(lua_Number *)(pRStack_48->data + (ulong)val_1._4_4_ * 8) = lStack_a8;
        }
        else {
          raviH_set_float((lua_State *)ci_local,pRStack_48,(ulong)val_1._4_4_,lStack_a8);
        }
      }
    }
  }
  ci_local->previous = *(CallInfo **)&ra_local->tt_;
  return;
}

Assistant:

void raviV_op_setlist(lua_State *L, CallInfo *ci, TValue *ra, int b, int c) {
  int n = b;
  unsigned int last;
  if (n == 0)
    n = cast_int(L->top - ra) - 1;
  last = ((c - 1) * LFIELDS_PER_FLUSH) + n;
  if (ttisLtable(ra)) {
    Table *h = hvalue(ra);
    if (last > h->sizearray)        /* needs more space? */
      luaH_resizearray(L, h, last); /* pre-allocate it at once */
    for (; n > 0; n--) {
      TValue *val = ra + n;
      luaH_setint(L, h, last--, val);
      luaC_barrierback(L, obj2gco(h), val);
    }
  }
  else {
    RaviArray *h = arrvalue(ra);
    int i = last - n + 1;
    for (; i <= (int)last; i++) {
      TValue *val = ra + i;
      unsigned int u = (unsigned int)(i);
      if ((h->flags & RAVI_ARRAY_ISFLOAT) == 0) {
        if (ttisinteger(val)) {
          raviH_set_int_inline(L, h, u, ivalue(val));
        }
        else {
          lua_Integer i = 0;
          if (tointegerns(val, &i)) {
            raviH_set_int_inline(L, h, u, i);
          }
          else
            luaG_runerror(L, "value cannot be converted to integer");
        }
      }
      else {
        if (ttisfloat(val)) {
          raviH_set_float_inline(L, h, u, fltvalue(val));
        }
        else if (ttisinteger(val)) {
          raviH_set_float_inline(L, h, u, (lua_Number)(ivalue(val)));
        }
        else {
          lua_Number d = 0.0;
          if (tonumberns(val, d)) {
            raviH_set_float_inline(L, h, u, d);
          }
          else
            luaG_runerror(L, "value cannot be converted to number");
        }
      }
    }
  }
  L->top = ci->top; /* correct top (in case of previous open call) */
}